

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

int ep_server_start_loop(char *port,void *userdata)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uStack_60;
  addrinfo *local_50;
  epoll_event event;
  
  BUF_SIZE = getpagesize();
  stack0xffffffffffffffc0 = 1;
  event._0_8_ = 0x200000001;
  iVar1 = getaddrinfo((char *)0x0,port,(addrinfo *)&event,&local_50);
  if (iVar1 == -1) {
    pcVar5 = "\x1b[31mERROR: %s: %s: %d: can not get socket descriptor!\x1b[m\n";
    uStack_60 = 0x24;
  }
  else {
    iVar1 = socket(local_50->ai_family,local_50->ai_socktype,local_50->ai_protocol);
    if (iVar1 == -1) {
      pcVar5 = "\x1b[31mERROR: %s: %s: %d: can not get socket descriptor!\x1b[m\n";
      uStack_60 = 0x2b;
    }
    else {
      iVar2 = bind(iVar1,local_50->ai_addr,local_50->ai_addrlen);
      if (iVar2 != -1) {
        freeaddrinfo(local_50);
        iVar2 = make_socket_non_block(iVar1);
        if (iVar2 == -1) {
          pcVar5 = "\x1b[31mERROR: %s: %s: %d: connot set flags!\x1b[m\n";
          uVar4 = 0xaa;
        }
        else {
          iVar2 = listen(iVar1,0x1000);
          if (iVar2 == -1) {
            pcVar5 = "\x1b[31mERROR: %s: %s: %d: cannot listen!\x1b[m\n";
            uVar4 = 0xb1;
          }
          else {
            iVar2 = epoll_create(1);
            if (iVar2 == -1) {
              pcVar5 = "\x1b[31mERROR: %s: %s: %d: cannot create epoll!\x1b[m\n";
              uVar4 = 0xb8;
            }
            else {
              event.data.fd = iVar1;
              event.events = 0x80000005;
              iVar3 = epoll_ctl(iVar2,1,iVar1,(epoll_event *)&event);
              if (iVar3 != -1) {
                sk_on_start(iVar2,userdata);
                do {
                  loop_once(iVar2,iVar1,&event);
                } while( true );
              }
              pcVar5 = "\x1b[31mERROR: %s: %s: %d: can not add event to epoll!\x1b[m\n";
              uVar4 = 0xc1;
            }
          }
        }
        goto LAB_00107029;
      }
      pcVar5 = "\x1b[31mERROR: %s: %s: %d: bind error!\x1b[m\n";
      uStack_60 = 0x32;
    }
  }
  printf(pcVar5,"epoll.cpp","create_and_bind",uStack_60);
  sk_on_global_error();
  pcVar5 = "\x1b[31mERROR: %s: %s: %d: cannot create socket!\x1b[m\n";
  uVar4 = 0xa3;
LAB_00107029:
  printf(pcVar5,"epoll.cpp","ep_server_start_loop",uVar4);
  sk_on_global_error();
  return -1;
}

Assistant:

int ep_server_start_loop(const char *port, void *userdata)
{
    init_settings();

    int sfd, res, epoll;
    struct epoll_event event;

    sfd = create_and_bind(port);
    if (sfd == -1) {
        LOGE("cannot create socket!");
        sk_on_global_error();
        return -1;
    }

    res = make_socket_non_block(sfd);
    if (res == -1) {
        LOGE("connot set flags!");
        sk_on_global_error();
        return -1;
    }

    res = listen(sfd, SOMAXCONN);
    if (res == -1) {
        LOGE("cannot listen!");
        sk_on_global_error();
        return -1;
    }

    epoll = epoll_create(1);
    if (epoll == -1) {
        LOGE("cannot create epoll!");
        sk_on_global_error();
        return -1;
    }

    event.events  = EPOLLIN | EPOLLOUT | EPOLLET;
    event.data.fd = sfd;
    res = epoll_ctl(epoll, EPOLL_CTL_ADD, sfd, &event);
    if (res == -1) {
        LOGE("can not add event to epoll!");
        sk_on_global_error();
        return -1;
    }

    sk_on_start(epoll, userdata);

    for (;;) {
        loop_once(epoll, sfd, event);
    }

    close(epoll);
    sk_on_close(epoll);

    return 0;
}